

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O1

complex<double> * c8vec_uniform_01_new(int n,int *seed)

{
  int iVar1;
  int iVar2;
  complex<double> *__s;
  int iVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  uVar4 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar4 = (long)n << 4;
  }
  __s = (complex<double> *)operator_new__(uVar4);
  if (n != 0) {
    memset(__s,0,(long)n << 4);
  }
  if (0 < n) {
    lVar5 = 0;
    do {
      iVar1 = (*seed % 0x1f31d) * 0x41a7;
      iVar3 = (*seed / 0x1f31d) * -0xb14;
      iVar2 = iVar1 + iVar3;
      iVar1 = iVar1 + iVar3 + 0x7fffffff;
      if (-1 < iVar2) {
        iVar1 = iVar2;
      }
      *seed = iVar1;
      dVar6 = (double)iVar1 * 4.656612875e-10;
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      iVar1 = (*seed % 0x1f31d) * 0x41a7;
      iVar3 = (*seed / 0x1f31d) * -0xb14;
      iVar2 = iVar1 + iVar3;
      iVar1 = iVar1 + iVar3 + 0x7fffffff;
      if (-1 < iVar2) {
        iVar1 = iVar2;
      }
      *seed = iVar1;
      dVar7 = (double)iVar1 * 4.656612875e-10 * 6.283185307179586;
      dVar8 = cos(dVar7);
      dVar7 = sin(dVar7);
      *(double *)((long)__s->_M_value + lVar5) = dVar8 * dVar6;
      *(double *)((long)__s->_M_value + lVar5 + 8) = dVar7 * dVar6;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(uint)n << 4 != lVar5);
  }
  return __s;
}

Assistant:

complex <double> *c8vec_uniform_01_new ( int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    C8VEC_UNIFORM_01_NEW returns a unit pseudorandom C8VEC.
//
//  Discussion:
//
//    A C8VEC is a vector of complex <double> values.
//
//    The angles should be uniformly distributed between 0 and 2 * PI,
//    the square roots of the radius uniformly distributed between 0 and 1.
//
//    This results in a uniform distribution of values in the unit circle.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    15 March 2005
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of values to compute.
//
//    Input/output, int &SEED, the "seed" value, which should NOT be 0.
//    On output, SEED has been updated.
//
//    Output, complex <double> C8VEC_UNIFORM_01_NEW[N], the pseudorandom 
//    complex vector.
//
{
  complex <double> *c;
  int i;
  double r;
  int k;
  const double r8_pi = 3.141592653589793;
  double theta;

  c = new complex <double> [n];

  for ( i = 0; i < n; i++ )
  {
    k = seed / 127773;

    seed = 16807 * ( seed - k * 127773 ) - k * 2836;

    if ( seed < 0 )
    {
      seed = seed + 2147483647;
    }

    r = sqrt ( static_cast<double>(seed) * 4.656612875E-10 );

    k = seed / 127773;

    seed = 16807 * ( seed - k * 127773 ) - k * 2836;

    if ( seed < 0 )
    {
      seed = seed + 2147483647;
    }

    theta = 2.0 * r8_pi * ( static_cast<double>(seed) * 4.656612875E-10 );

    c[i] = r * complex <double> ( cos ( theta ), sin ( theta ) );
  }

  return c;
}